

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SentencePieceLearner.cc
# Opt level: O1

void __thiscall onmt::SentencePieceLearner::~SentencePieceLearner(SentencePieceLearner *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  basic_ofstream<char,_std::char_traits<char>_> *pbVar2;
  pointer pcVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  
  (this->super_SubwordLearner)._vptr_SubwordLearner =
       (_func_int **)&PTR__SentencePieceLearner_00380ec0;
  if (this->_keep_input_file == false) {
    remove((this->_input_filename)._M_dataplus._M_p);
  }
  pbVar2 = (this->_input_stream)._M_t.
           super___uniq_ptr_impl<std::basic_ofstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::basic_ofstream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
           .super__Head_base<0UL,_std::basic_ofstream<char,_std::char_traits<char>_>_*,_false>.
           _M_head_impl;
  if (pbVar2 != (basic_ofstream<char,_std::char_traits<char>_> *)0x0) {
    (**(code **)(*(long *)pbVar2 + 8))();
  }
  (this->_input_stream)._M_t.
  super___uniq_ptr_impl<std::basic_ofstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::basic_ofstream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
  .super__Head_base<0UL,_std::basic_ofstream<char,_std::char_traits<char>_>_*,_false>._M_head_impl =
       (basic_ofstream<char,_std::char_traits<char>_> *)0x0;
  pcVar3 = (this->_input_filename)._M_dataplus._M_p;
  paVar1 = &(this->_input_filename).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  pcVar3 = (this->_args)._M_dataplus._M_p;
  paVar1 = &(this->_args).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  (this->super_SubwordLearner)._vptr_SubwordLearner = (_func_int **)&PTR__SubwordLearner_00380f98;
  this_00 = (this->super_SubwordLearner)._default_tokenizer.
            super___shared_ptr<const_onmt::Tokenizer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    return;
  }
  return;
}

Assistant:

SentencePieceLearner::~SentencePieceLearner()
  {
    if (!_keep_input_file) {
      remove(_input_filename.c_str());
    }
  }